

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha.h
# Opt level: O0

uint32_t * __thiscall sha1::SHA1::getDigest(SHA1 *this,uint32_t *digest)

{
  uint32_t *in_RSI;
  SHA1 *in_RDI;
  size_t bitCount;
  uint8_t in_stack_ffffffffffffffdf;
  
  processByte(in_RDI,in_stack_ffffffffffffffdf);
  if (in_RDI->m_blockByteIndex < 0x39) {
    while (in_RDI->m_blockByteIndex < 0x38) {
      processByte(in_RDI,in_stack_ffffffffffffffdf);
    }
  }
  else {
    while (in_RDI->m_blockByteIndex != 0) {
      processByte(in_RDI,in_stack_ffffffffffffffdf);
    }
    while (in_RDI->m_blockByteIndex < 0x38) {
      processByte(in_RDI,in_stack_ffffffffffffffdf);
    }
  }
  processByte(in_RDI,in_stack_ffffffffffffffdf);
  processByte(in_RDI,in_stack_ffffffffffffffdf);
  processByte(in_RDI,in_stack_ffffffffffffffdf);
  processByte(in_RDI,in_stack_ffffffffffffffdf);
  processByte(in_RDI,in_stack_ffffffffffffffdf);
  processByte(in_RDI,in_stack_ffffffffffffffdf);
  processByte(in_RDI,in_stack_ffffffffffffffdf);
  processByte(in_RDI,in_stack_ffffffffffffffdf);
  *(undefined8 *)in_RSI = *(undefined8 *)in_RDI->m_digest;
  *(undefined8 *)(in_RSI + 2) = *(undefined8 *)(in_RDI->m_digest + 2);
  in_RSI[4] = in_RDI->m_digest[4];
  return in_RSI;
}

Assistant:

const uint32_t *getDigest(digest32_t digest) {
    size_t bitCount = this->m_byteCount * 8;
    processByte(0x80);
    if (this->m_blockByteIndex > 56) {
      while (m_blockByteIndex != 0) {
        processByte(0);
      }
      while (m_blockByteIndex < 56) {
        processByte(0);
      }
    } else {
      while (m_blockByteIndex < 56) {
        processByte(0);
      }
    }
    processByte(0);
    processByte(0);
    processByte(0);
    processByte(0);
    processByte(static_cast<unsigned char>((bitCount >> 24) & 0xFF));
    processByte(static_cast<unsigned char>((bitCount >> 16) & 0xFF));
    processByte(static_cast<unsigned char>((bitCount >> 8) & 0xFF));
    processByte(static_cast<unsigned char>((bitCount)&0xFF));

    memcpy(digest, m_digest, 5 * sizeof(uint32_t));
    return digest;
  }